

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::~DescriptorNode(DescriptorNode *this)

{
  DescriptorNode *this_local;
  
  std::__cxx11::string::~string((string *)(this + 0x148));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (this + 0x130));
  std::__cxx11::string::~string((string *)(this + 0xf8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
          *)(this + 200));
  std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::~vector
            ((vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *)
             (this + 0xb0));
  std::__cxx11::string::~string((string *)(this + 0x88));
  std::__cxx11::string::~string((string *)(this + 0x68));
  std::__cxx11::string::~string((string *)(this + 0x40));
  std::__cxx11::string::~string((string *)(this + 0x20));
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorNode {
 public:
  /**
   * @brief parse output descriptor.
   * @param[in] output_descriptor   output descriptor
   * @param[in] network_parameters  network parameter
   * @return DescriptorNode object
   */
  static DescriptorNode Parse(
      const std::string& output_descriptor,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief generate to checksum from descriptor.
   * @param[in] descriptor  output descriptor
   * @return checksum
   */
  static std::string GenerateChecksum(const std::string& descriptor);

  /**
   * @brief constructor.
   */
  DescriptorNode();
  /**
   * @brief constructor.
   * @param[in] network_parameters  network parameter
   */
  explicit DescriptorNode(
      const std::vector<AddressFormatData>& network_parameters);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorNode object
   */
  DescriptorNode(const DescriptorNode& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorNode object
   * @return DescriptorNode object
   */
  DescriptorNode& operator=(const DescriptorNode& object);

  /**
   * @brief get reference object.
   * @param[in] array_argument  argument
   * @param[in] parent          parent object
   * @return reference object
   */
  DescriptorScriptReference GetReference(
      std::vector<std::string>* array_argument,
      const DescriptorNode* parent = nullptr) const;

  /**
   * @brief get reference object list.
   * @param[in] array_argument  argument
   * @param[in] parent          parent object
   * @return reference object list
   */
  std::vector<DescriptorScriptReference> GetReferences(
      std::vector<std::string>* array_argument,
      const DescriptorNode* parent = nullptr) const;

  /**
   * @brief Get the number required for argument.
   * @return argument number.
   */
  uint32_t GetNeedArgumentNum() const;

  /**
   * @brief getting output descriptor.
   * @param[in] append_checksum  append checksum
   * @return output descriptor
   */
  std::string ToString(bool append_checksum = true) const;

  /**
   * @brief Get the type of DescriptorNode.
   * @return DescriptorNodeType
   */
  DescriptorNodeType GetNodeType() const { return node_type_; }
  /**
   * @brief Get the Script type of DescriptorNode.
   * @return DescriptorScriptType
   */
  DescriptorScriptType GetScriptType() const { return script_type_; }

  /**
   * @brief check checksum.
   * @param[in] descriptor    check target descriptor.
   */
  void CheckChecksum(const std::string& descriptor);

 protected:
  /**
   * @brief get pubkey.
   * @param[in] array_argument  argument array.
   * @return pubkey
   */
  Pubkey GetPubkey(std::vector<std::string>* array_argument) const;
  /**
   * @brief get script tree.
   * @param[in] array_argument  argument array.
   * @return TapBranch
   */
  TapBranch GetTapBranch(std::vector<std::string>* array_argument) const;
  /**
   * @brief get key reference object.
   * @param[in] array_argument  argument
   * @return key reference object list
   */
  DescriptorKeyReference GetKeyReferences(
      std::vector<std::string>* array_argument) const;

 private:
  std::string name_;                        //!< node name
  std::string value_;                       //!< node value
  std::string key_info_;                    //!< key information
  bool is_uncompressed_key_ = false;        //!< exist uncompressed key
  std::string base_extkey_;                 //!< extkey base
  std::string tweak_sum_;                   //!< extpubkey tweak sum
  uint32_t number_ = 0;                     //!< number value
  std::vector<DescriptorNode> child_node_;  //!< child nodes
  std::map<std::string, DescriptorNode> tree_node_;  //!< scripttree nodes
  std::string checksum_;                             //!< checksum
  uint32_t depth_ = 0;                               //!< depth
  uint32_t need_arg_num_ = 0;                        //!< need argument num
  DescriptorNodeType node_type_;                     //!< node type
  DescriptorScriptType script_type_;                 //!< node script type
  DescriptorKeyType key_type_;                       //!< node key type
  std::vector<AddressFormatData> addr_prefixes_;     //!< address prefixes
  std::string parent_kind_;                          //!< parent kind

  /**
   * @brief analyze child node.
   * @param[in] descriptor  output descriptor
   * @param[in] depth       node depth
   */
  void AnalyzeChild(const std::string& descriptor, uint32_t depth);
  /**
   * @brief analyze all node.
   * @param[in] parent_name  parent node name
   */
  void AnalyzeAll(const std::string& parent_name);
  /**
   * @brief analyze script tree.
   */
  void AnalyzeScriptTree();
  /**
   * @brief analyze key node.
   */
  void AnalyzeKey();
  /**
   * @brief check uncompressed key.
   * @retval true exist
   * @retval false not exist
   */
  bool ExistUncompressedKey();
}